

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert-llama2c-to-ggml.cpp
# Opt level: O0

void __thiscall my_llama_file::read_raw(my_llama_file *this,void *ptr,size_t size)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  size_t sVar3;
  char *pcVar4;
  size_t in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  size_t ret;
  
  if (in_RDX != 0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    sVar3 = fread(in_RSI,in_RDX,1,(FILE *)*in_RDI);
    iVar1 = ferror((FILE *)*in_RDI);
    __stream = _stderr;
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      pcVar4 = strerror(*piVar2);
      fprintf(__stream,"error: fread failed: %s\n",pcVar4);
      exit(1);
    }
    if (sVar3 != 1) {
      fputs("error: unexpectedly reached end of file\n",_stderr);
      exit(1);
    }
  }
  return;
}

Assistant:

void read_raw(void * ptr, size_t size) {
        if (size == 0) {
            return;
        }
        errno = 0;
        std::size_t ret = std::fread(ptr, size, 1, fp);
        if (ferror(fp)) {
            die_fmt("fread failed: %s", strerror(errno));
        }
        if (ret != 1) {
            die("unexpectedly reached end of file");
        }
    }